

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_transaction_manager.cpp
# Opt level: O2

Transaction * __thiscall
duckdb::DuckTransactionManager::StartTransaction
          (DuckTransactionManager *this,ClientContext *context)

{
  ulong uVar1;
  transaction_t __p;
  MetaTransaction *pMVar2;
  type pDVar3;
  InternalException *this_00;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::DuckTransaction_*,_false> local_58;
  unique_ptr<std::lock_guard<std::mutex>,_std::default_delete<std::lock_guard<std::mutex>_>,_true>
  start_lock;
  transaction_t transaction_id;
  transaction_t start_time;
  
  pMVar2 = TransactionContext::ActiveTransaction(&context->transaction);
  start_lock.
  super_unique_ptr<std::lock_guard<std::mutex>,_std::default_delete<std::lock_guard<std::mutex>_>_>.
  _M_t.
  super___uniq_ptr_impl<std::lock_guard<std::mutex>,_std::default_delete<std::lock_guard<std::mutex>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::lock_guard<std::mutex>_*,_std::default_delete<std::lock_guard<std::mutex>_>_>
  .super__Head_base<0UL,_std::lock_guard<std::mutex>_*,_false>._M_head_impl =
       (unique_ptr<std::lock_guard<std::mutex>,_std::default_delete<std::lock_guard<std::mutex>_>_>)
       (__uniq_ptr_data<std::lock_guard<std::mutex>,_std::default_delete<std::lock_guard<std::mutex>_>,_true,_true>
        )0x0;
  if (pMVar2->is_read_only == false) {
    make_uniq<std::lock_guard<std::mutex>,std::mutex&>
              ((duckdb *)&start_time,&this->start_transaction_lock);
    __p = start_time;
    start_time = 0;
    ::std::
    __uniq_ptr_impl<std::lock_guard<std::mutex>,_std::default_delete<std::lock_guard<std::mutex>_>_>
    ::reset((__uniq_ptr_impl<std::lock_guard<std::mutex>,_std::default_delete<std::lock_guard<std::mutex>_>_>
             *)&start_lock,(pointer)__p);
    ::std::
    unique_ptr<std::lock_guard<std::mutex>,_std::default_delete<std::lock_guard<std::mutex>_>_>::
    ~unique_ptr((unique_ptr<std::lock_guard<std::mutex>,_std::default_delete<std::lock_guard<std::mutex>_>_>
                 *)&start_time);
  }
  ::std::mutex::lock(&this->transaction_lock);
  uVar1 = this->current_start_timestamp;
  if (uVar1 < 0x4000000000000060) {
    this->current_start_timestamp = uVar1 + 1;
    transaction_id = this->current_transaction_id;
    this->current_transaction_id = transaction_id + 1;
    if ((this->active_transactions).
        super_vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->active_transactions).
        super_vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      LOCK();
      (this->lowest_active_start).super___atomic_base<unsigned_long>._M_i = uVar1;
      UNLOCK();
      LOCK();
      (this->lowest_active_id).super___atomic_base<unsigned_long>._M_i = transaction_id;
      UNLOCK();
    }
    start_time = uVar1;
    make_uniq<duckdb::DuckTransaction,duckdb::DuckTransactionManager&,duckdb::ClientContext&,unsigned_long&,unsigned_long&,unsigned_long&>
              ((duckdb *)&local_58,this,context,&start_time,&transaction_id,
               &this->last_committed_version);
    pDVar3 = unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
             ::operator*((unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
                          *)&local_58);
    ::std::
    vector<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>,std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>>
              ((vector<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>,std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>>>
                *)&this->active_transactions,
               (unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
                *)&local_58);
    if (local_58._M_head_impl != (DuckTransaction *)0x0) {
      (*((local_58._M_head_impl)->super_Transaction)._vptr_Transaction[1])();
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->transaction_lock);
    ::std::
    unique_ptr<std::lock_guard<std::mutex>,_std::default_delete<std::lock_guard<std::mutex>_>_>::
    ~unique_ptr(&start_lock.
                 super_unique_ptr<std::lock_guard<std::mutex>,_std::default_delete<std::lock_guard<std::mutex>_>_>
               );
    return &pDVar3->super_Transaction;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&start_time,
             "Cannot start more transactions, ran out of transaction identifiers!",
             (allocator *)&transaction_id);
  InternalException::InternalException(this_00,(string *)&start_time);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

Transaction &DuckTransactionManager::StartTransaction(ClientContext &context) {
	// obtain the transaction lock during this function
	auto &meta_transaction = MetaTransaction::Get(context);
	unique_ptr<lock_guard<mutex>> start_lock;
	if (!meta_transaction.IsReadOnly()) {
		start_lock = make_uniq<lock_guard<mutex>>(start_transaction_lock);
	}
	lock_guard<mutex> lock(transaction_lock);
	if (current_start_timestamp >= TRANSACTION_ID_START) { // LCOV_EXCL_START
		throw InternalException("Cannot start more transactions, ran out of "
		                        "transaction identifiers!");
	} // LCOV_EXCL_STOP

	// obtain the start time and transaction ID of this transaction
	transaction_t start_time = current_start_timestamp++;
	transaction_t transaction_id = current_transaction_id++;
	if (active_transactions.empty()) {
		lowest_active_start = start_time;
		lowest_active_id = transaction_id;
	}

	// create the actual transaction
	auto transaction = make_uniq<DuckTransaction>(*this, context, start_time, transaction_id, last_committed_version);
	auto &transaction_ref = *transaction;

	// store it in the set of active transactions
	active_transactions.push_back(std::move(transaction));
	return transaction_ref;
}